

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

size_t sorter_merge_sort_in_place_backmerge(int64_t *dst1,size_t l1,int64_t *dst2,size_t l2)

{
  long lVar1;
  size_t sVar2;
  long in_RCX;
  long *in_RDX;
  size_t in_RSI;
  long *in_RDI;
  int64_t _sort_swap_temp_2;
  int64_t _sort_swap_temp_1;
  int64_t _sort_swap_temp;
  int64_t *dst0;
  size_t res;
  long *local_38;
  long local_28;
  long *local_20;
  size_t local_18;
  long *local_10;
  size_t local_8;
  
  local_38 = in_RDX + in_RSI;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_20 = in_RDX;
  local_28 = in_RCX;
  if (in_RDI[1 - in_RSI] - *in_RDX < 0) {
    do {
      while (sVar2 = local_18, -1 < *local_20 - *local_10) {
        lVar1 = *local_20;
        *local_20 = *local_38;
        *local_38 = lVar1;
        local_20 = local_20 + -1;
        local_38 = local_38 + -1;
        local_28 = local_28 + -1;
        if (local_28 == 0) {
          do {
            lVar1 = *local_10;
            *local_10 = *local_38;
            *local_38 = lVar1;
            local_10 = local_10 + -1;
            local_38 = local_38 + -1;
            local_18 = local_18 - 1;
          } while (local_18 != 0);
          return sVar2;
        }
      }
      lVar1 = *local_10;
      *local_10 = *local_38;
      *local_38 = lVar1;
      local_10 = local_10 + -1;
      local_38 = local_38 + -1;
      local_18 = local_18 - 1;
    } while (local_18 != 0);
    local_8 = 0;
  }
  else {
    sorter_merge_sort_in_place_aswap(in_RDI + (1 - in_RSI),local_38 + (1 - in_RSI),in_RSI);
    local_8 = in_RSI;
  }
  return local_8;
}

Assistant:

size_t MERGE_SORT_IN_PLACE_BACKMERGE(SORT_TYPE *dst1, size_t l1,
                                     SORT_TYPE *dst2, size_t l2) {
  size_t res;
  SORT_TYPE *dst0 = dst2 + l1;

  if (SORT_CMP(dst1[1 - l1], dst2[0]) >= 0) {
    MERGE_SORT_IN_PLACE_ASWAP(dst1 - l1 + 1, dst0 - l1 + 1, l1);
    return l1;
  }

  do {
    while (SORT_CMP(*dst2, *dst1) < 0) {
      SORT_SWAP(*dst1, *dst0);
      dst1--;
      dst0--;

      if (--l1 == 0) {
        return 0;
      }
    }

    SORT_SWAP(*dst2, *dst0);
    dst2--;
    dst0--;
  } while (--l2);

  res = l1;

  do {
    SORT_SWAP(*dst1, *dst0);
    dst1--;
    dst0--;
  } while (--l1);

  return res;
}